

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

int __thiscall
tetgenmesh::checkfac4split(tetgenmesh *this,face *chkfac,point *encpt,int *qflag,double *cent)

{
  int iVar1;
  shellface *pppdVar2;
  shellface ppdVar3;
  tetgenmesh *this_00;
  shellface ppdVar4;
  double *pdVar5;
  double dVar6;
  double dVar7;
  bool bVar8;
  uint uVar9;
  tetgenbehavior *ptVar10;
  point pdVar11;
  undefined4 *puVar12;
  bool bVar13;
  shellface ppdVar14;
  tetgenmesh *this_01;
  uint uVar15;
  ulong uVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  int indx [4];
  double D;
  int local_f8 [6];
  double local_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  undefined1 local_b8 [16];
  double local_a8;
  double local_98;
  double dStack_90;
  double local_88;
  double local_78;
  double local_70;
  double local_68;
  
  *encpt = (point)0x0;
  *qflag = 0;
  pppdVar2 = chkfac->sh;
  iVar1 = chkfac->shver;
  ppdVar3 = pppdVar2[sorgpivot[iVar1]];
  this_00 = (tetgenmesh *)pppdVar2[sdestpivot[iVar1]];
  ppdVar4 = pppdVar2[sapexpivot[iVar1]];
  pdVar5 = *ppdVar3;
  dVar6 = (double)this_00->in - (double)pdVar5;
  dVar17 = (double)this_00->addin - (double)ppdVar3[1];
  local_b8._8_4_ = SUB84(dVar17,0);
  local_b8._0_8_ = dVar6;
  local_b8._12_4_ = (int)((ulong)dVar17 >> 0x20);
  local_98 = (double)*ppdVar4 - (double)pdVar5;
  dStack_90 = (double)ppdVar4[1] - (double)ppdVar3[1];
  local_a8 = (double)this_00->b - (double)ppdVar3[2];
  local_88 = (double)ppdVar4[2] - (double)ppdVar3[2];
  dVar19 = dVar6 * dStack_90 - dVar17 * local_98;
  dVar18 = dVar17 * local_88 - dStack_90 * local_a8;
  dVar20 = local_88 * dVar6 - local_a8 * local_98;
  local_70 = -dVar20;
  local_d8 = (local_a8 * local_a8 + dVar6 * dVar6 + dVar17 * dVar17) * 0.5;
  dStack_d0 = (local_88 * local_88 + local_98 * local_98 + dStack_90 * dStack_90) * 0.5;
  local_c8 = 0.0;
  this_01 = this_00;
  local_78 = dVar18;
  local_68 = dVar19;
  bVar8 = lu_decmp(this_00,(double (*) [4])local_b8,3,local_f8,&local_e0,0);
  if (!bVar8) {
    puVar12 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar12 = 2;
    __cxa_throw(puVar12,&int::typeinfo,0);
  }
  dVar6 = SQRT(dVar19 * dVar19 + dVar18 * dVar18 + dVar20 * dVar20) * 0.5;
  lu_solve(this_01,(double (*) [4])local_b8,3,local_f8,&local_d8,0);
  dVar19 = local_c8;
  dVar18 = dStack_d0;
  dVar17 = local_d8;
  *cent = (double)pdVar5 + local_d8;
  cent[1] = (double)ppdVar3[1] + dStack_d0;
  cent[2] = (double)ppdVar3[2] + local_c8;
  if (((this->checkconstraints == 0) || ((double)pppdVar2[this->areaboundindex] <= 0.0)) ||
     (dVar6 <= (double)pppdVar2[this->areaboundindex])) {
    ptVar10 = this->b;
    if (ptVar10->fixedvolume != 0) {
      if (dVar6 < 0.0) {
        dVar20 = sqrt(dVar6);
      }
      else {
        dVar20 = SQRT(dVar6);
      }
      ptVar10 = this->b;
      if (ptVar10->maxvolume <= dVar20 * dVar6 && dVar20 * dVar6 != ptVar10->maxvolume)
      goto LAB_00149a22;
    }
    if (ptVar10->varvolume != 0) {
      ppdVar14 = chkfac->sh[(ulong)(chkfac->shver & 1) + 9];
      uVar16 = (ulong)ppdVar14 & 0xfffffffffffffff0;
      if (uVar16 != 0) {
        ppdVar14 = (shellface)(ulong)(uint)stpivottbl[(uint)ppdVar14 & 0xf][chkfac->shver];
      }
      pdVar11 = *(point *)(uVar16 + 0x38);
      if ((*(point *)(uVar16 + 0x38) != this->dummypoint) &&
         (dVar20 = *(double *)(uVar16 + (long)this->volumeboundindex * 8),
         pdVar11 = this->dummypoint, 0.0 < dVar20)) {
        if (dVar6 < 0.0) {
          dVar7 = sqrt(dVar6);
        }
        else {
          dVar7 = SQRT(dVar6);
        }
        if (dVar20 < dVar7 * dVar6) goto LAB_00149a22;
        pdVar11 = this->dummypoint;
      }
      uVar16 = *(ulong *)(uVar16 + (ulong)((uint)ppdVar14 & 3) * 8) & 0xfffffffffffffff0;
      if ((*(point *)(uVar16 + 0x38) != pdVar11) &&
         (dVar20 = *(double *)(uVar16 + (long)this->volumeboundindex * 8), 0.0 < dVar20)) {
        if (dVar6 < 0.0) {
          dVar7 = sqrt(dVar6);
        }
        else {
          dVar7 = SQRT(dVar6);
        }
        if (dVar20 < dVar6 * dVar7) goto LAB_00149a22;
      }
    }
    dVar6 = SQRT(dVar19 * dVar19 + dVar17 * dVar17 + dVar18 * dVar18);
    if (this->b->metric != 0) {
      iVar1 = this->pointmtrindex;
      if ((((0.0 < (double)ppdVar3[iVar1]) && ((double)ppdVar3[iVar1] < dVar6)) ||
          ((0.0 < (double)(&this_00->in)[iVar1] && ((double)(&this_00->in)[iVar1] < dVar6)))) ||
         ((0.0 < (double)ppdVar4[iVar1] && ((double)ppdVar4[iVar1] < dVar6)))) goto LAB_00149a22;
    }
    uVar9 = chkfac->shver;
    dVar17 = 0.0;
    bVar8 = true;
    do {
      bVar13 = bVar8;
      uVar15 = (uint)chkfac->sh[(ulong)(uVar9 & 1) + 9] & 0xf;
      uVar16 = (ulong)chkfac->sh[(ulong)(uVar9 & 1) + 9] & 0xfffffffffffffff0;
      if (uVar16 != 0) {
        uVar15 = stpivottbl[uVar15][(int)uVar9];
      }
      if (*(point *)(uVar16 + 0x38) != this->dummypoint) {
        pdVar5 = *(double **)(uVar16 + (long)oppopivot[(int)uVar15] * 8);
        dVar18 = SQRT((cent[2] - pdVar5[2]) * (cent[2] - pdVar5[2]) +
                      (*cent - *pdVar5) * (*cent - *pdVar5) +
                      (cent[1] - pdVar5[1]) * (cent[1] - pdVar5[1]));
        uVar16 = -(ulong)(ABS(dVar18 - dVar6) / dVar6 < this->b->epsilon);
        dVar18 = (double)(uVar16 & (ulong)dVar6 | ~uVar16 & (ulong)dVar18);
        if ((dVar18 < dVar6) && (((dVar17 == 0.0 && (!NAN(dVar17))) || (dVar18 < dVar17)))) {
          *encpt = pdVar5;
          dVar17 = dVar18;
        }
      }
      uVar9 = uVar9 ^ 1;
      chkfac->shver = uVar9;
      bVar8 = false;
    } while (bVar13);
    uVar9 = (uint)(*encpt != (point)0x0);
  }
  else {
LAB_00149a22:
    *qflag = 1;
    uVar9 = 1;
  }
  return uVar9;
}

Assistant:

int tetgenmesh::checkfac4split(face *chkfac, point& encpt, int& qflag, 
                               REAL *cent)
{
  point pa, pb, pc;
  REAL area, rd, len;
  REAL A[4][4], rhs[4], D;
  int indx[4];
  int i;

  encpt = NULL;
  qflag = 0;

  pa = sorg(*chkfac);
  pb = sdest(*chkfac);
  pc = sapex(*chkfac);

  // Compute the coefficient matrix A (3x3).
  A[0][0] = pb[0] - pa[0];
  A[0][1] = pb[1] - pa[1];
  A[0][2] = pb[2] - pa[2]; // vector V1 (pa->pb)
  A[1][0] = pc[0] - pa[0];
  A[1][1] = pc[1] - pa[1];
  A[1][2] = pc[2] - pa[2]; // vector V2 (pa->pc)
  cross(A[0], A[1], A[2]); // vector V3 (V1 X V2)

  area = 0.5 * sqrt(dot(A[2], A[2])); // The area of [a,b,c].

  // Compute the right hand side vector b (3x1).
  rhs[0] = 0.5 * dot(A[0], A[0]); // edge [a,b]
  rhs[1] = 0.5 * dot(A[1], A[1]); // edge [a,c]
  rhs[2] = 0.0;

  // Solve the 3 by 3 equations use LU decomposition with partial 
  //   pivoting and backward and forward substitute.
  if (!lu_decmp(A, 3, indx, &D, 0)) {
    // A degenerate triangle. 
    terminatetetgen(this, 2);
  }

  lu_solve(A, 3, indx, rhs, 0);
  cent[0] = pa[0] + rhs[0];
  cent[1] = pa[1] + rhs[1];
  cent[2] = pa[2] + rhs[2];
  rd = sqrt(rhs[0] * rhs[0] + rhs[1] * rhs[1] + rhs[2] * rhs[2]);

  if (checkconstraints && (areabound(*chkfac) > 0.0)) {
    // Check if the subface has too big area.
    if (area > areabound(*chkfac)) {
      qflag = 1;
      return 1;
    }
  }

  if (b->fixedvolume) {
    if ((area * sqrt(area)) > b->maxvolume) {
      qflag = 1;
      return 1;
    }
  }

  if (b->varvolume) {
    triface adjtet;
    REAL volbnd;
    int t1ver;

    stpivot(*chkfac, adjtet);
    if (!ishulltet(adjtet)) {
      volbnd = volumebound(adjtet.tet);
      if ((volbnd > 0) && (area * sqrt(area)) > volbnd) {
        qflag = 1;
        return 1;
      }
    }
    fsymself(adjtet);
    if (!ishulltet(adjtet)) {
      volbnd = volumebound(adjtet.tet);
      if ((volbnd > 0) && (area * sqrt(area)) > volbnd) {
        qflag = 1;
        return 1;
      }
    }
  }

  if (b->metric) { // -m option. Check mesh size. 
    // Check if the ccent lies outside one of the prot.balls at vertices.
    if (((pa[pointmtrindex] > 0) && (rd > pa[pointmtrindex])) ||
        ((pb[pointmtrindex] > 0) && (rd > pb[pointmtrindex])) ||
        ((pc[pointmtrindex] > 0) && (rd > pc[pointmtrindex]))) {
      qflag = 1; // Enforce mesh size.
      return 1;
    }
  }

  triface searchtet;
  REAL smlen = 0;

  // Check if this subface is locally encroached.
  for (i = 0; i < 2; i++) {
    stpivot(*chkfac, searchtet);
    if (!ishulltet(searchtet)) {
      len = distance(oppo(searchtet), cent);
      if ((fabs(len - rd) / rd) < b->epsilon) len = rd;// Rounding.
      if (len < rd) {
        if (smlen == 0) {
          smlen = len;
          encpt = oppo(searchtet);
        } else {
          if (len < smlen) {
            smlen = len;
            encpt = oppo(searchtet);
          }
        }
        //return 1;
      }
    }
    sesymself(*chkfac);
  }

  return encpt != NULL; //return 0;
}